

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Node<int,_QEvdevTouchScreenData::Contact> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_>::findNode<int>
          (Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *this,int *key)

{
  long lVar1;
  bool bVar2;
  Node<int,_QEvdevTouchScreenData::Contact> *pNVar3;
  int *in_RDI;
  long in_FS_OFFSET;
  Bucket bucket;
  Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  findBucket<int>(in_stack_ffffffffffffffe0,in_RDI);
  bVar2 = Bucket::isUnused((Bucket *)0x12317b);
  if (bVar2) {
    pNVar3 = (Node<int,_QEvdevTouchScreenData::Contact> *)0x0;
  }
  else {
    pNVar3 = Bucket::node((Bucket *)0x123196);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pNVar3;
  }
  __stack_chk_fail();
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }